

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O1

void __thiscall QBuffer::QBuffer(QBuffer *this,QObject *parent)

{
  QObjectData *pQVar1;
  QIODevicePrivate *this_00;
  
  this_00 = (QIODevicePrivate *)operator_new(0x1b8);
  QIODevicePrivate::QIODevicePrivate(this_00,QObjectPrivateVersion);
  (this_00->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QBufferPrivate_006a74f8;
  this_00[1].super_QObjectPrivate.super_QObjectData._vptr_QObjectData = (_func_int **)0x0;
  this_00[1].super_QObjectPrivate.super_QObjectData.q_ptr = (QObject *)0x0;
  this_00[1].super_QObjectPrivate.super_QObjectData.parent = (QObject *)0x0;
  this_00[1].super_QObjectPrivate.super_QObjectData.children.d.d = (Data *)0x0;
  *(undefined8 *)((long)&this_00[1].super_QObjectPrivate.super_QObjectData.children.d.d + 5) = 0;
  *(undefined8 *)((long)&this_00[1].super_QObjectPrivate.super_QObjectData.children.d.ptr + 5) = 0;
  QIODevice::QIODevice(&this->super_QIODevice,this_00,parent);
  (this->super_QIODevice).super_QObject._vptr_QObject = (_func_int **)&PTR_metaObject_006a73b8;
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  pQVar1[4].bindingStorage.bindingStatus = (QBindingStatus *)(pQVar1 + 5);
  return;
}

Assistant:

QBuffer::QBuffer(QObject *parent)
    : QIODevice(*new QBufferPrivate, parent)
{
    Q_D(QBuffer);
    d->buf = &d->defaultBuf;
}